

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O3

SockData * AGSSock::SockData_CreateFromString(char *str)

{
  string *psVar1;
  allocator<char> local_31;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,str,&local_31);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar1,local_30,local_28 + (long)local_30);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,psVar1,&agsSockData);
  return (SockData *)psVar1;
}

Assistant:

SockData *SockData_CreateFromString(const char *str)
{
	SockData *data = new SockData(str);
	AGS_OBJECT(SockData, data);
	return data;
}